

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalSavepointUndo(Wal *pWal,u32 *aWalData)

{
  uint uVar1;
  int extraout_EAX;
  
  if (aWalData[3] == pWal->nCkpt) {
    uVar1 = *aWalData;
  }
  else {
    *aWalData = 0;
    aWalData[3] = pWal->nCkpt;
    uVar1 = 0;
  }
  if (uVar1 < (pWal->hdr).mxFrame) {
    (pWal->hdr).mxFrame = uVar1;
    (pWal->hdr).aFrameCksum[0] = aWalData[1];
    (pWal->hdr).aFrameCksum[1] = aWalData[2];
    walCleanupHash(pWal);
    return extraout_EAX;
  }
  return uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalSavepointUndo(Wal *pWal, u32 *aWalData){
  int rc = SQLITE_OK;

  assert( pWal->writeLock );
  assert( aWalData[3]!=pWal->nCkpt || aWalData[0]<=pWal->hdr.mxFrame );

  if( aWalData[3]!=pWal->nCkpt ){
    /* This savepoint was opened immediately after the write-transaction
    ** was started. Right after that, the writer decided to wrap around
    ** to the start of the log. Update the savepoint values to match.
    */
    aWalData[0] = 0;
    aWalData[3] = pWal->nCkpt;
  }

  if( aWalData[0]<pWal->hdr.mxFrame ){
    pWal->hdr.mxFrame = aWalData[0];
    pWal->hdr.aFrameCksum[0] = aWalData[1];
    pWal->hdr.aFrameCksum[1] = aWalData[2];
    walCleanupHash(pWal);
  }

  return rc;
}